

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coll.cpp
# Opt level: O0

UBool icu_63::isAvailableLocaleListInitialized(UErrorCode *status)

{
  UBool UVar1;
  UErrorCode *status_local;
  
  umtx_initOnce(&gAvailableLocaleListInitOnce,initAvailableLocaleList,status);
  UVar1 = ::U_SUCCESS(*status);
  return UVar1;
}

Assistant:

static UBool isAvailableLocaleListInitialized(UErrorCode &status) {
    umtx_initOnce(gAvailableLocaleListInitOnce, &initAvailableLocaleList, status);
    return U_SUCCESS(status);
}